

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parsePrecRange(Parser *this)

{
  bool bVar1;
  Parser *in_RSI;
  bool local_8a;
  unique_ptr<enact::BinaryExpr,_std::default_delete<enact::BinaryExpr>_> local_70;
  undefined1 local_68 [8];
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> rightExpr;
  Token oper;
  Parser *this_local;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *expr;
  
  parsePrecBitwiseOr(this);
  while( true ) {
    bVar1 = consume(in_RSI,DOT_DOT);
    local_8a = true;
    if (!bVar1) {
      local_8a = consume(in_RSI,DOT_DOT_DOT);
    }
    if (local_8a == false) break;
    Token::Token((Token *)&rightExpr,&in_RSI->m_previous);
    parsePrecBitwiseOr((Parser *)local_68);
    std::
    make_unique<enact::BinaryExpr,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,enact::Token>
              ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)&local_70,
               (unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)this,(Token *)local_68)
    ;
    std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>::operator=
              ((unique_ptr<enact::Expr,std::default_delete<enact::Expr>> *)this,&local_70);
    std::unique_ptr<enact::BinaryExpr,_std::default_delete<enact::BinaryExpr>_>::~unique_ptr
              (&local_70);
    std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::~unique_ptr
              ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_68);
    Token::~Token((Token *)&rightExpr);
  }
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parsePrecRange() {
        std::unique_ptr<Expr> expr = parsePrecBitwiseOr();

        while (consume(TokenType::DOT_DOT) || consume(TokenType::DOT_DOT_DOT)) {
            Token oper = m_previous;
            std::unique_ptr<Expr> rightExpr = parsePrecBitwiseOr();
            expr = std::make_unique<BinaryExpr>(std::move(expr), std::move(rightExpr), std::move(oper));
        }

        return expr;
    }